

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::IgnorablesMatcher::IgnorablesMatcher(IgnorablesMatcher *this,Key key)

{
  UnicodeString local_48;
  
  local_48.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  local_48.fUnion.fStackFields.fLengthAndFlags = 2;
  SymbolMatcher::SymbolMatcher(&this->super_SymbolMatcher,&local_48,key);
  UnicodeString::~UnicodeString(&local_48);
  (this->super_SymbolMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003e0f80;
  return;
}

Assistant:

IgnorablesMatcher::IgnorablesMatcher(unisets::Key key)
        : SymbolMatcher({}, key) {
}